

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetLanguages
          (cmGeneratorTarget *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,string *config)

{
  size_type sVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  bool bVar4;
  string *__v;
  cmGeneratorTarget **ppcVar5;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  pointer ppcVar6;
  pointer ppcVar7;
  long lVar8;
  pointer ppcVar9;
  _Alloc_hider _Var10;
  cmGeneratorTarget **ppcVar11;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectLibraries;
  string objLib;
  cmGeneratorTarget *tgt;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_b8;
  string local_98;
  cmGeneratorTarget *local_70;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_68;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_48;
  
  bVar4 = cmTarget::CanCompileSources(this->Target);
  if (bVar4) {
    local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetSourceFiles(this,&local_48,config);
    ppcVar3 = local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar9 = local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar3;
        ppcVar9 = ppcVar9 + 1) {
      __v = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(*ppcVar9);
      if (__v->_M_string_length != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)languages,__v);
      }
    }
    local_b8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_start = (cmGeneratorTarget **)0x0;
    local_b8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (cmGeneratorTarget **)0x0;
    local_b8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (cmGeneratorTarget **)0x0;
    local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      GetObjectLibrariesCMP0026
                (this,(vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_98
                );
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::reserve
                (&local_b8,(long)(local_98._M_string_length - (long)local_98._M_dataplus._M_p) >> 3)
      ;
      sVar1 = local_98._M_string_length;
      if (local_98._M_dataplus._M_p != (pointer)local_98._M_string_length) {
        _Var10._M_p = local_98._M_dataplus._M_p;
        do {
          local_70 = *(cmGeneratorTarget **)_Var10._M_p;
          if (local_b8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_b8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
            _M_realloc_insert<cmGeneratorTarget*const&>
                      ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            *local_b8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_70;
            local_b8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          _Var10._M_p = _Var10._M_p + 8;
        } while (_Var10._M_p != (pointer)sVar1);
      }
      ppcVar11 = local_b8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar5 = local_b8.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (local_98._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_98._M_dataplus._M_p,
                        local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
        ppcVar11 = local_b8.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar5 = local_b8.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else {
      GetExternalObjects(this,&local_68,config);
      ppcVar2 = local_68.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppcVar11 = local_b8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar5 = local_b8.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        ppcVar6 = local_68.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_98,*ppcVar6);
          local_70 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,&local_98);
          if (local_70 != (cmGeneratorTarget *)0x0) {
            lVar8 = (long)local_b8.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b8.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            ppcVar7 = local_b8.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (0 < lVar8) {
              ppcVar7 = (pointer)(((long)local_b8.
                                         super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_b8.
                                         super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start &
                                  0xffffffffffffffe0U) +
                                 (long)local_b8.
                                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
              lVar8 = lVar8 + 1;
              ppcVar5 = local_b8.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + 2;
              do {
                if (ppcVar5[-2] == local_70) {
                  ppcVar5 = ppcVar5 + -2;
                  goto LAB_003f4483;
                }
                if (ppcVar5[-1] == local_70) {
                  ppcVar5 = ppcVar5 + -1;
                  goto LAB_003f4483;
                }
                if (*ppcVar5 == local_70) goto LAB_003f4483;
                if (ppcVar5[1] == local_70) {
                  ppcVar5 = ppcVar5 + 1;
                  goto LAB_003f4483;
                }
                lVar8 = lVar8 + -1;
                ppcVar5 = ppcVar5 + 4;
              } while (1 < lVar8);
            }
            lVar8 = (long)local_b8.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar7 >> 3;
            if (lVar8 == 1) {
LAB_003f4467:
              ppcVar5 = ppcVar7;
              if (*ppcVar7 != local_70) {
                ppcVar5 = local_b8.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            else if (lVar8 == 2) {
LAB_003f445e:
              ppcVar5 = ppcVar7;
              if (*ppcVar7 != local_70) {
                ppcVar7 = ppcVar7 + 1;
                goto LAB_003f4467;
              }
            }
            else {
              ppcVar5 = local_b8.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((lVar8 == 3) && (ppcVar5 = ppcVar7, *ppcVar7 != local_70)) {
                ppcVar7 = ppcVar7 + 1;
                goto LAB_003f445e;
              }
            }
LAB_003f4483:
            if (local_b8.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish == ppcVar5) {
              if (local_b8.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_b8.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
                _M_realloc_insert<cmGeneratorTarget*const&>
                          ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)
                           &local_b8,
                           (iterator)
                           local_b8.
                           super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_70);
              }
              else {
                *local_b8.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_70;
                local_b8.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_b8.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          ppcVar6 = ppcVar6 + 1;
          ppcVar11 = local_b8.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppcVar5 = local_b8.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        } while (ppcVar6 != ppcVar2);
      }
    }
    for (; ppcVar11 != ppcVar5; ppcVar11 = ppcVar11 + 1) {
      GetLanguages(*ppcVar11,languages,config);
    }
    if (local_68.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (cmGeneratorTarget **)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetLanguages(std::set<std::string>& languages,
                                     const std::string& config) const
{
  // Targets that do not compile anything have no languages.
  if (!this->CanCompileSources()) {
    return;
  }

  std::vector<cmSourceFile*> sourceFiles;
  this->GetSourceFiles(sourceFiles, config);
  for (cmSourceFile* src : sourceFiles) {
    const std::string& lang = src->GetOrDetermineLanguage();
    if (!lang.empty()) {
      languages.insert(lang);
    }
  }

  std::vector<cmGeneratorTarget*> objectLibraries;
  std::vector<cmSourceFile const*> externalObjects;
  if (!this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    std::vector<cmGeneratorTarget*> objectTargets;
    this->GetObjectLibrariesCMP0026(objectTargets);
    objectLibraries.reserve(objectTargets.size());
    for (cmGeneratorTarget* gt : objectTargets) {
      objectLibraries.push_back(gt);
    }
  } else {
    this->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* extObj : externalObjects) {
      std::string objLib = extObj->GetObjectLibrary();
      if (cmGeneratorTarget* tgt =
            this->LocalGenerator->FindGeneratorTargetToUse(objLib)) {
        auto const objLibIt =
          std::find_if(objectLibraries.cbegin(), objectLibraries.cend(),
                       [tgt](cmGeneratorTarget* t) { return t == tgt; });
        if (objectLibraries.cend() == objLibIt) {
          objectLibraries.push_back(tgt);
        }
      }
    }
  }
  for (cmGeneratorTarget* objLib : objectLibraries) {
    objLib->GetLanguages(languages, config);
  }
}